

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_manager_impl.c
# Opt level: O1

void loader_manager_impl_script_paths_destroy(vector script_paths)

{
  size_t sVar1;
  undefined8 *puVar2;
  size_t position;
  
  sVar1 = vector_size(script_paths);
  if (sVar1 != 0) {
    position = 0;
    do {
      puVar2 = (undefined8 *)vector_at(script_paths,position);
      free((void *)*puVar2);
      position = position + 1;
    } while (sVar1 != position);
  }
  vector_destroy(script_paths);
  return;
}

Assistant:

void loader_manager_impl_script_paths_destroy(vector script_paths)
{
	size_t iterator, size = vector_size(script_paths);

	for (iterator = 0; iterator < size; ++iterator)
	{
		char *path = vector_at_type(script_paths, iterator, char *);

		free(path);
	}

	vector_destroy(script_paths);
}